

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t HUF_compress1X_usingCTable_internal_default
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable)

{
  bool bVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  size_t sVar11;
  ulong *puVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  HUF_CStream_t bitC;
  HUF_CStream_t local_58;
  
  if (dstSize < 8) {
    return 0;
  }
  local_58.bitPos[0] = 0;
  local_58.bitPos[1] = 0;
  local_58.bitContainer[0] = 0;
  local_58.bitContainer[1] = 0;
  local_58.endPtr = (BYTE *)((long)dst + (dstSize - 8));
  if (dstSize == 8) {
    return 0;
  }
  uVar3 = (uint)*CTable;
  uVar4 = (uint)srcSize;
  local_58.ptr = (BYTE *)dst;
  local_58.startPtr = (BYTE *)dst;
  if (0xb < uVar3 || dstSize < ((*CTable & 0xffffffff) * srcSize >> 3) + 8) {
    uVar3 = uVar4 + 3;
    if (-1 < (int)uVar4) {
      uVar3 = uVar4;
    }
    iVar13 = uVar4 - (uVar3 & 0xfffffffc);
    if (0 < iVar13) {
      pbVar5 = (byte *)((long)(int)uVar4 + (long)src);
      iVar13 = iVar13 + 1;
      uVar8 = 0;
      do {
        pbVar5 = pbVar5 + -1;
        uVar10 = CTable[(ulong)*pbVar5 + 1];
        if (0xc < (uVar10 & 0xff)) goto LAB_001a8822;
        uVar8 = uVar8 + uVar10;
        local_58.bitContainer[0] =
             uVar10 & 0xffffffffffffff00 | local_58.bitContainer[0] >> ((byte)uVar10 & 0x3f);
        uVar10 = uVar8 & 0xff;
        if (0x40 < uVar10) goto LAB_001a8803;
        srcSize = (size_t)((int)srcSize - 1);
        iVar13 = iVar13 + -1;
      } while (1 < iVar13);
      local_58.bitPos[0] = (size_t)((uint)uVar8 & 7);
      if (uVar10 == 0) goto LAB_001a8841;
      if (local_58.endPtr < dst) goto LAB_001a8860;
      local_58.ptr = (BYTE *)((uVar10 >> 3) + (long)dst);
      if (local_58.endPtr < local_58.ptr) {
        local_58.ptr = local_58.endPtr;
      }
      *(size_t *)dst = local_58.bitContainer[0] >> (-(char)uVar8 & 0x3fU);
    }
    if ((srcSize & 3) != 0) goto LAB_001a88dc;
    if ((srcSize & 4) != 0) {
      lVar2 = (long)(int)srcSize;
      lVar6 = 3;
      sVar9 = local_58.bitPos[0];
      sVar11 = local_58.bitContainer[0];
      do {
        uVar8 = CTable[(ulong)*(byte *)((long)src + lVar6 + lVar2 + -4) + 1];
        if (0xc < (uVar8 & 0xff)) goto LAB_001a8822;
        sVar9 = sVar9 + uVar8;
        if (0x40 < ((uint)sVar9 & 0xff)) goto LAB_001a8803;
        sVar11 = sVar11 >> ((byte)uVar8 & 0x3f) | uVar8;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
      uVar8 = CTable[(ulong)*(byte *)((long)src + lVar2 + -4) + 1];
      if (0xc < (uVar8 & 0xff)) goto LAB_001a8822;
      uVar10 = sVar9 + uVar8;
      local_58.bitContainer[0] = uVar8 & 0xffffffffffffff00 | sVar11 >> ((byte)uVar8 & 0x3f);
      uVar8 = uVar10 & 0xff;
      if (0x40 < uVar8) goto LAB_001a8803;
      local_58.bitPos[0] = (size_t)((uint)uVar10 & 7);
      if (uVar8 == 0) goto LAB_001a8841;
      if (local_58.endPtr < local_58.ptr) goto LAB_001a8860;
      srcSize = lVar2 - 4;
      puVar12 = (ulong *)((uVar8 >> 3) + (long)local_58.ptr);
      if (local_58.endPtr < puVar12) {
        puVar12 = (ulong *)local_58.endPtr;
      }
      *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-(char)uVar10 & 0x3fU);
      local_58.ptr = (BYTE *)puVar12;
    }
    if ((srcSize & 7) == 0) {
      if (0 < (int)srcSize) {
        uVar8 = srcSize & 0xffffffff;
        lVar2 = (long)src + (uVar8 - 1);
        lVar6 = (long)src + (uVar8 - 5);
        do {
          lVar14 = 3;
          sVar9 = local_58.bitContainer[0];
          sVar11 = local_58.bitPos[0];
          do {
            uVar10 = CTable[(ulong)*(byte *)(lVar2 + -3 + lVar14) + 1];
            if (0xc < (uVar10 & 0xff)) goto LAB_001a8822;
            sVar11 = sVar11 + uVar10;
            if (0x40 < ((uint)sVar11 & 0xff)) goto LAB_001a8803;
            sVar9 = sVar9 >> ((byte)uVar10 & 0x3f) | uVar10;
            lVar14 = lVar14 + -1;
          } while (lVar14 != 0);
          uVar10 = CTable[(ulong)*(byte *)((uVar8 - 4) + (long)src) + 1];
          if (0xc < (uVar10 & 0xff)) goto LAB_001a8822;
          uVar7 = sVar11 + uVar10;
          local_58.bitContainer[0] = uVar10 & 0xffffffffffffff00 | sVar9 >> ((byte)uVar10 & 0x3f);
          uVar10 = uVar7 & 0xff;
          if (0x40 < uVar10) goto LAB_001a8803;
          local_58.bitPos[0] = (size_t)((uint)uVar7 & 7);
          if (uVar10 == 0) goto LAB_001a8841;
          if (local_58.endPtr < local_58.ptr) goto LAB_001a8860;
          puVar12 = (ulong *)((uVar10 >> 3) + (long)local_58.ptr);
          if (local_58.endPtr < puVar12) {
            puVar12 = (ulong *)local_58.endPtr;
          }
          *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-(char)uVar7 & 0x3fU);
          lVar15 = 3;
          lVar14 = 0;
          uVar10 = 0;
          do {
            uVar7 = CTable[(ulong)*(byte *)(lVar6 + -3 + lVar15) + 1];
            if (0xc < (uVar7 & 0xff)) goto LAB_001a8822;
            lVar14 = lVar14 + uVar7;
            if (0x40 < ((uint)lVar14 & 0xff)) goto LAB_001a8803;
            uVar10 = uVar10 >> ((byte)uVar7 & 0x3f) | uVar7;
            lVar15 = lVar15 + -1;
          } while (lVar15 != 0);
          uVar7 = CTable[(ulong)*(byte *)((long)src + (uVar8 - 8)) + 1];
          if (0xc < (uVar7 & 0xff)) goto LAB_001a8822;
          local_58.bitPos[1] = lVar14 + uVar7;
          local_58.bitContainer[1] = uVar7 & 0xffffffffffffff00 | uVar10 >> ((byte)uVar7 & 0x3f);
          if (0x40 < (local_58.bitPos[1] & 0xff)) goto LAB_001a8803;
          if ((int)(local_58.bitPos[1] & 0xff) == 0x40) goto LAB_001a88bd;
          local_58.bitContainer[0] =
               local_58.bitContainer[0] >> ((byte)local_58.bitPos[1] & 0x3f) |
               local_58.bitContainer[1];
          uVar10 = local_58.bitPos[1] + local_58.bitPos[0];
          uVar7 = uVar10 & 0xff;
          if (0x40 < uVar7) goto LAB_001a889e;
          local_58.bitPos[0] = (size_t)((uint)uVar10 & 7);
          if (uVar7 == 0) goto LAB_001a8841;
          local_58.ptr = (BYTE *)((uVar7 >> 3) + (long)puVar12);
          if (local_58.endPtr < local_58.ptr) {
            local_58.ptr = local_58.endPtr;
          }
          *puVar12 = local_58.bitContainer[0] >> (-(char)uVar10 & 0x3fU);
          srcSize = uVar8 - 8;
          lVar2 = lVar2 + -8;
          lVar6 = lVar6 + -8;
          bVar1 = 8 < (long)uVar8;
          uVar8 = srcSize;
        } while (bVar1);
      }
      goto LAB_001a87dd;
    }
LAB_001a88fb:
    __assert_fail("n % (2 * kUnroll) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3eb4,
                  "void HUF_compress1X_usingCTable_internal_body_loop(HUF_CStream_t *, const BYTE *, size_t, const HUF_CElt *, int, int, int)"
                 );
  }
  switch(uVar3) {
  case 7:
    uVar3 = uVar4 + 7;
    if (-1 < (int)uVar4) {
      uVar3 = uVar4;
    }
    iVar13 = uVar4 - (uVar3 & 0xfffffff8);
    if (0 < iVar13) {
      pbVar5 = (byte *)((long)(int)uVar4 + (long)src);
      iVar13 = iVar13 + 1;
      uVar8 = 0;
      do {
        pbVar5 = pbVar5 + -1;
        uVar10 = CTable[(ulong)*pbVar5 + 1];
        if (0xc < (uVar10 & 0xff)) goto LAB_001a8822;
        uVar8 = uVar8 + uVar10;
        local_58.bitContainer[0] =
             uVar10 & 0xffffffffffffff00 | local_58.bitContainer[0] >> ((byte)uVar10 & 0x3f);
        uVar10 = uVar8 & 0xff;
        if (0x40 < uVar10) goto LAB_001a8803;
        srcSize = (size_t)((int)srcSize - 1);
        iVar13 = iVar13 + -1;
      } while (1 < iVar13);
      local_58.bitPos[0] = (size_t)((uint)uVar8 & 7);
      if (uVar10 == 0) goto LAB_001a8841;
      if (local_58.endPtr < dst) goto LAB_001a8860;
      *(size_t *)dst = local_58.bitContainer[0] >> (-(char)uVar8 & 0x3fU);
      local_58.ptr = (BYTE *)((long)dst + (uVar10 >> 3));
      if (local_58.endPtr < local_58.ptr) goto LAB_001a887f;
    }
    if ((srcSize & 7) != 0) goto LAB_001a88dc;
    if ((srcSize & 8) != 0) {
      lVar2 = (long)(int)srcSize;
      lVar6 = 7;
      sVar9 = local_58.bitPos[0];
      sVar11 = local_58.bitContainer[0];
      do {
        uVar8 = CTable[(ulong)*(byte *)((long)src + lVar6 + lVar2 + -8) + 1];
        if (0xc < (uVar8 & 0xff)) goto LAB_001a8822;
        sVar9 = sVar9 + uVar8;
        if (0x40 < ((uint)sVar9 & 0xff)) goto LAB_001a8803;
        sVar11 = sVar11 >> ((byte)uVar8 & 0x3f) | uVar8;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
      uVar8 = CTable[(ulong)*(byte *)((long)src + lVar2 + -8) + 1];
      if (0xc < (uVar8 & 0xff)) {
LAB_001a8822:
        __assert_fail("HUF_getNbBits(elt) <= HUF_TABLELOG_ABSOLUTEMAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3e2b,"void HUF_addBits(HUF_CStream_t *, HUF_CElt, int, int)");
      }
      uVar10 = sVar9 + uVar8;
      local_58.bitContainer[0] = uVar8 & 0xffffffffffffff00 | sVar11 >> ((byte)uVar8 & 0x3f);
      uVar8 = uVar10 & 0xff;
      if (0x40 < uVar8) {
LAB_001a8803:
        __assert_fail("(bitC->bitPos[idx] & 0xFF) <= HUF_BITS_IN_CONTAINER",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3e37,"void HUF_addBits(HUF_CStream_t *, HUF_CElt, int, int)");
      }
      local_58.bitPos[0] = (size_t)((uint)uVar10 & 7);
      if (uVar8 == 0) {
LAB_001a8841:
        __assert_fail("nbBits > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3e6d,"void HUF_flushBits(HUF_CStream_t *, int)");
      }
      if (local_58.endPtr < local_58.ptr) {
LAB_001a8860:
        __assert_fail("bitC->ptr <= bitC->endPtr",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3e6f,"void HUF_flushBits(HUF_CStream_t *, int)");
      }
      *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-(char)uVar10 & 0x3fU);
      local_58.ptr = (BYTE *)((uVar8 >> 3) + (long)local_58.ptr);
      if (local_58.endPtr < local_58.ptr) {
LAB_001a887f:
        __assert_fail("!kFast || bitC->ptr <= bitC->endPtr",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3e72,"void HUF_flushBits(HUF_CStream_t *, int)");
      }
      srcSize = lVar2 - 8;
    }
    if ((srcSize & 0xf) != 0) goto LAB_001a88fb;
    if (0 < (int)srcSize) {
      uVar8 = srcSize & 0xffffffff;
      lVar2 = (long)src + (uVar8 - 1);
      lVar6 = (long)src + (uVar8 - 9);
      do {
        lVar14 = 7;
        sVar9 = local_58.bitContainer[0];
        sVar11 = local_58.bitPos[0];
        do {
          uVar10 = CTable[(ulong)*(byte *)(lVar2 + -7 + lVar14) + 1];
          if (0xc < (uVar10 & 0xff)) goto LAB_001a8822;
          sVar11 = sVar11 + uVar10;
          if (0x40 < ((uint)sVar11 & 0xff)) goto LAB_001a8803;
          sVar9 = sVar9 >> ((byte)uVar10 & 0x3f) | uVar10;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
        uVar10 = CTable[(ulong)*(byte *)((uVar8 - 8) + (long)src) + 1];
        if (0xc < (uVar10 & 0xff)) goto LAB_001a8822;
        uVar7 = sVar11 + uVar10;
        local_58.bitContainer[0] = uVar10 & 0xffffffffffffff00 | sVar9 >> ((byte)uVar10 & 0x3f);
        uVar10 = uVar7 & 0xff;
        if (0x40 < uVar10) goto LAB_001a8803;
        local_58.bitPos[0] = (size_t)((uint)uVar7 & 7);
        if (uVar10 == 0) goto LAB_001a8841;
        if (local_58.endPtr < local_58.ptr) goto LAB_001a8860;
        *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-(char)uVar7 & 0x3fU);
        puVar12 = (ulong *)((uVar10 >> 3) + (long)local_58.ptr);
        if (local_58.endPtr < puVar12) goto LAB_001a887f;
        lVar15 = 7;
        lVar14 = 0;
        uVar10 = 0;
        do {
          uVar7 = CTable[(ulong)*(byte *)(lVar6 + -7 + lVar15) + 1];
          if (0xc < (uVar7 & 0xff)) goto LAB_001a8822;
          lVar14 = lVar14 + uVar7;
          if (0x40 < ((uint)lVar14 & 0xff)) goto LAB_001a8803;
          uVar10 = uVar10 >> ((byte)uVar7 & 0x3f) | uVar7;
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
        uVar7 = CTable[(ulong)*(byte *)((long)src + (uVar8 - 0x10)) + 1];
        if (0xc < (uVar7 & 0xff)) goto LAB_001a8822;
        local_58.bitPos[1] = lVar14 + uVar7;
        local_58.bitContainer[1] = uVar7 & 0xffffffffffffff00 | uVar10 >> ((byte)uVar7 & 0x3f);
        if (0x40 < (local_58.bitPos[1] & 0xff)) goto LAB_001a8803;
        if ((int)(local_58.bitPos[1] & 0xff) == 0x40) {
LAB_001a88bd:
          __assert_fail("(bitC->bitPos[1] & 0xFF) < HUF_BITS_IN_CONTAINER",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3e56,"void HUF_mergeIndex1(HUF_CStream_t *)");
        }
        local_58.bitContainer[0] =
             local_58.bitContainer[0] >> ((byte)local_58.bitPos[1] & 0x3f) |
             local_58.bitContainer[1];
        uVar10 = local_58.bitPos[1] + local_58.bitPos[0];
        uVar7 = uVar10 & 0xff;
        if (0x40 < uVar7) {
LAB_001a889e:
          __assert_fail("(bitC->bitPos[0] & 0xFF) <= HUF_BITS_IN_CONTAINER",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3e5a,"void HUF_mergeIndex1(HUF_CStream_t *)");
        }
        local_58.bitPos[0] = (size_t)((uint)uVar10 & 7);
        if (uVar7 == 0) goto LAB_001a8841;
        *puVar12 = local_58.bitContainer[0] >> (-(char)uVar10 & 0x3fU);
        local_58.ptr = (BYTE *)((uVar7 >> 3) + (long)puVar12);
        if (local_58.endPtr < local_58.ptr) goto LAB_001a887f;
        srcSize = uVar8 - 0x10;
        lVar2 = lVar2 + -0x10;
        lVar6 = lVar6 + -0x10;
        bVar1 = 0x10 < (long)uVar8;
        uVar8 = srcSize;
      } while (bVar1);
    }
    break;
  case 8:
    if (0 < (int)uVar4 % 7) {
      pbVar5 = (byte *)((long)(int)uVar4 + (long)src);
      iVar13 = (int)uVar4 % 7 + 1;
      uVar8 = 0;
      do {
        pbVar5 = pbVar5 + -1;
        uVar10 = CTable[(ulong)*pbVar5 + 1];
        if (0xc < (uVar10 & 0xff)) goto LAB_001a8822;
        uVar8 = uVar8 + uVar10;
        local_58.bitContainer[0] =
             uVar10 & 0xffffffffffffff00 | local_58.bitContainer[0] >> ((byte)uVar10 & 0x3f);
        uVar10 = uVar8 & 0xff;
        if (0x40 < uVar10) goto LAB_001a8803;
        srcSize = (size_t)((int)srcSize - 1);
        iVar13 = iVar13 + -1;
      } while (1 < iVar13);
      local_58.bitPos[0] = (size_t)((uint)uVar8 & 7);
      if (uVar10 == 0) goto LAB_001a8841;
      if (local_58.endPtr < dst) goto LAB_001a8860;
      *(size_t *)dst = local_58.bitContainer[0] >> (-(char)uVar8 & 0x3fU);
      local_58.ptr = (BYTE *)((long)dst + (uVar10 >> 3));
      if (local_58.endPtr < local_58.ptr) goto LAB_001a887f;
    }
    uVar4 = (int)srcSize * -0x49249249 + 0x12492492;
    if (uVar4 < 0x24924925) {
      if (0x12492492 < (uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f)) {
        lVar2 = (long)(int)srcSize;
        lVar6 = 6;
        sVar9 = local_58.bitPos[0];
        sVar11 = local_58.bitContainer[0];
        do {
          uVar8 = CTable[(ulong)*(byte *)((long)src + lVar6 + lVar2 + -7) + 1];
          if (0xc < (uVar8 & 0xff)) goto LAB_001a8822;
          sVar9 = sVar9 + uVar8;
          if (0x40 < ((uint)sVar9 & 0xff)) goto LAB_001a8803;
          sVar11 = sVar11 >> ((byte)uVar8 & 0x3f) | uVar8;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
        uVar8 = CTable[(ulong)*(byte *)((long)src + lVar2 + -7) + 1];
        if (0xc < (uVar8 & 0xff)) goto LAB_001a8822;
        uVar10 = sVar9 + uVar8;
        local_58.bitContainer[0] = uVar8 & 0xffffffffffffff00 | sVar11 >> ((byte)uVar8 & 0x3f);
        uVar8 = uVar10 & 0xff;
        if (0x40 < uVar8) goto LAB_001a8803;
        local_58.bitPos[0] = (size_t)((uint)uVar10 & 7);
        if (uVar8 == 0) goto LAB_001a8841;
        if (local_58.endPtr < local_58.ptr) goto LAB_001a8860;
        *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-(char)uVar10 & 0x3fU);
        local_58.ptr = (BYTE *)((uVar8 >> 3) + (long)local_58.ptr);
        if (local_58.endPtr < local_58.ptr) goto LAB_001a887f;
        srcSize = lVar2 - 7;
      }
      uVar4 = (int)srcSize * -0x49249249 + 0x12492492;
      if ((uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f) < 0x12492493) {
        if (0 < (int)srcSize) {
          uVar8 = srcSize & 0xffffffff;
          lVar2 = (long)src + (uVar8 - 1);
          lVar6 = (long)src + (uVar8 - 8);
          do {
            lVar14 = 6;
            sVar9 = local_58.bitContainer[0];
            sVar11 = local_58.bitPos[0];
            do {
              uVar10 = CTable[(ulong)*(byte *)(lVar2 + -6 + lVar14) + 1];
              if (0xc < (uVar10 & 0xff)) goto LAB_001a8822;
              sVar11 = sVar11 + uVar10;
              if (0x40 < ((uint)sVar11 & 0xff)) goto LAB_001a8803;
              sVar9 = sVar9 >> ((byte)uVar10 & 0x3f) | uVar10;
              lVar14 = lVar14 + -1;
            } while (lVar14 != 0);
            uVar10 = CTable[(ulong)*(byte *)((uVar8 - 7) + (long)src) + 1];
            if (0xc < (uVar10 & 0xff)) goto LAB_001a8822;
            uVar7 = sVar11 + uVar10;
            local_58.bitContainer[0] = uVar10 & 0xffffffffffffff00 | sVar9 >> ((byte)uVar10 & 0x3f);
            uVar10 = uVar7 & 0xff;
            if (0x40 < uVar10) goto LAB_001a8803;
            local_58.bitPos[0] = (size_t)((uint)uVar7 & 7);
            if (uVar10 == 0) goto LAB_001a8841;
            if (local_58.endPtr < local_58.ptr) goto LAB_001a8860;
            *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-(char)uVar7 & 0x3fU);
            puVar12 = (ulong *)((uVar10 >> 3) + (long)local_58.ptr);
            if (local_58.endPtr < puVar12) goto LAB_001a887f;
            lVar15 = 6;
            lVar14 = 0;
            uVar10 = 0;
            do {
              uVar7 = CTable[(ulong)*(byte *)(lVar6 + -6 + lVar15) + 1];
              if (0xc < (uVar7 & 0xff)) goto LAB_001a8822;
              lVar14 = lVar14 + uVar7;
              if (0x40 < ((uint)lVar14 & 0xff)) goto LAB_001a8803;
              uVar10 = uVar10 >> ((byte)uVar7 & 0x3f) | uVar7;
              lVar15 = lVar15 + -1;
            } while (lVar15 != 0);
            uVar7 = CTable[(ulong)*(byte *)((long)src + (uVar8 - 0xe)) + 1];
            if (0xc < (uVar7 & 0xff)) goto LAB_001a8822;
            local_58.bitPos[1] = lVar14 + uVar7;
            local_58.bitContainer[1] = uVar7 & 0xffffffffffffff00 | uVar10 >> ((byte)uVar7 & 0x3f);
            if (0x40 < (local_58.bitPos[1] & 0xff)) goto LAB_001a8803;
            if ((int)(local_58.bitPos[1] & 0xff) == 0x40) goto LAB_001a88bd;
            local_58.bitContainer[0] =
                 local_58.bitContainer[0] >> ((byte)local_58.bitPos[1] & 0x3f) |
                 local_58.bitContainer[1];
            uVar10 = local_58.bitPos[1] + local_58.bitPos[0];
            uVar7 = uVar10 & 0xff;
            if (0x40 < uVar7) goto LAB_001a889e;
            local_58.bitPos[0] = (size_t)((uint)uVar10 & 7);
            if (uVar7 == 0) goto LAB_001a8841;
            *puVar12 = local_58.bitContainer[0] >> (-(char)uVar10 & 0x3fU);
            local_58.ptr = (BYTE *)((uVar7 >> 3) + (long)puVar12);
            if (local_58.endPtr < local_58.ptr) goto LAB_001a887f;
            srcSize = uVar8 - 0xe;
            lVar2 = lVar2 + -0xe;
            lVar6 = lVar6 + -0xe;
            bVar1 = 0xe < (long)uVar8;
            uVar8 = srcSize;
          } while (bVar1);
        }
        break;
      }
      goto LAB_001a88fb;
    }
LAB_001a88dc:
    __assert_fail("n % kUnroll == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3ea8,
                  "void HUF_compress1X_usingCTable_internal_body_loop(HUF_CStream_t *, const BYTE *, size_t, const HUF_CElt *, int, int, int)"
                 );
  case 9:
    if (0 < (int)uVar4 % 6) {
      pbVar5 = (byte *)((long)(int)uVar4 + (long)src);
      iVar13 = (int)uVar4 % 6 + 1;
      uVar8 = 0;
      do {
        pbVar5 = pbVar5 + -1;
        uVar10 = CTable[(ulong)*pbVar5 + 1];
        if (0xc < (uVar10 & 0xff)) goto LAB_001a8822;
        uVar8 = uVar8 + uVar10;
        local_58.bitContainer[0] =
             uVar10 & 0xffffffffffffff00 | local_58.bitContainer[0] >> ((byte)uVar10 & 0x3f);
        uVar10 = uVar8 & 0xff;
        if (0x40 < uVar10) goto LAB_001a8803;
        srcSize = (size_t)((int)srcSize - 1);
        iVar13 = iVar13 + -1;
      } while (1 < iVar13);
      local_58.bitPos[0] = (size_t)((uint)uVar8 & 7);
      if (uVar10 == 0) goto LAB_001a8841;
      if (local_58.endPtr < dst) goto LAB_001a8860;
      *(size_t *)dst = local_58.bitContainer[0] >> (-(char)uVar8 & 0x3fU);
      local_58.ptr = (BYTE *)((long)dst + (uVar10 >> 3));
      if (local_58.endPtr < local_58.ptr) goto LAB_001a887f;
    }
    iVar13 = (int)srcSize;
    uVar4 = iVar13 * -0x55555555 + 0x2aaaaaaa;
    if (0x2aaaaaaa < (uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f)) goto LAB_001a88dc;
    if (0x15555554 < (iVar13 * -0x55555555 + 0x2aaaaaa8U >> 2 | iVar13 * -0x40000000)) {
      lVar2 = (long)iVar13;
      lVar6 = 5;
      sVar9 = local_58.bitPos[0];
      sVar11 = local_58.bitContainer[0];
      do {
        uVar8 = CTable[(ulong)*(byte *)((long)src + lVar6 + lVar2 + -6) + 1];
        if (0xc < (uVar8 & 0xff)) goto LAB_001a8822;
        sVar9 = sVar9 + uVar8;
        if (0x40 < ((uint)sVar9 & 0xff)) goto LAB_001a8803;
        sVar11 = sVar11 >> ((byte)uVar8 & 0x3f) | uVar8;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
      uVar8 = CTable[(ulong)*(byte *)((long)src + lVar2 + -6) + 1];
      if (0xc < (uVar8 & 0xff)) goto LAB_001a8822;
      uVar10 = sVar9 + uVar8;
      local_58.bitContainer[0] = uVar8 & 0xffffffffffffff00 | sVar11 >> ((byte)uVar8 & 0x3f);
      uVar8 = uVar10 & 0xff;
      if (0x40 < uVar8) goto LAB_001a8803;
      local_58.bitPos[0] = (size_t)((uint)uVar10 & 7);
      if (uVar8 == 0) goto LAB_001a8841;
      if (local_58.endPtr < local_58.ptr) goto LAB_001a8860;
      *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-(char)uVar10 & 0x3fU);
      local_58.ptr = (BYTE *)((uVar8 >> 3) + (long)local_58.ptr);
      if (local_58.endPtr < local_58.ptr) goto LAB_001a887f;
      srcSize = lVar2 - 6;
    }
    iVar13 = (int)srcSize;
    if (0x15555554 < (iVar13 * -0x55555555 + 0x2aaaaaa8U >> 2 | iVar13 * -0x40000000))
    goto LAB_001a88fb;
    if (0 < iVar13) {
      uVar8 = srcSize & 0xffffffff;
      lVar2 = (long)src + (uVar8 - 1);
      lVar6 = (long)src + (uVar8 - 7);
      do {
        lVar14 = 5;
        sVar9 = local_58.bitContainer[0];
        sVar11 = local_58.bitPos[0];
        do {
          uVar10 = CTable[(ulong)*(byte *)(lVar2 + -5 + lVar14) + 1];
          if (0xc < (uVar10 & 0xff)) goto LAB_001a8822;
          sVar11 = sVar11 + uVar10;
          if (0x40 < ((uint)sVar11 & 0xff)) goto LAB_001a8803;
          sVar9 = sVar9 >> ((byte)uVar10 & 0x3f) | uVar10;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
        uVar10 = CTable[(ulong)*(byte *)((uVar8 - 6) + (long)src) + 1];
        if (0xc < (uVar10 & 0xff)) goto LAB_001a8822;
        uVar7 = sVar11 + uVar10;
        local_58.bitContainer[0] = uVar10 & 0xffffffffffffff00 | sVar9 >> ((byte)uVar10 & 0x3f);
        uVar10 = uVar7 & 0xff;
        if (0x40 < uVar10) goto LAB_001a8803;
        local_58.bitPos[0] = (size_t)((uint)uVar7 & 7);
        if (uVar10 == 0) goto LAB_001a8841;
        if (local_58.endPtr < local_58.ptr) goto LAB_001a8860;
        *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-(char)uVar7 & 0x3fU);
        puVar12 = (ulong *)((uVar10 >> 3) + (long)local_58.ptr);
        if (local_58.endPtr < puVar12) goto LAB_001a887f;
        lVar15 = 5;
        lVar14 = 0;
        uVar10 = 0;
        do {
          uVar7 = CTable[(ulong)*(byte *)(lVar6 + -5 + lVar15) + 1];
          if (0xc < (uVar7 & 0xff)) goto LAB_001a8822;
          lVar14 = lVar14 + uVar7;
          if (0x40 < ((uint)lVar14 & 0xff)) goto LAB_001a8803;
          uVar10 = uVar10 >> ((byte)uVar7 & 0x3f) | uVar7;
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
        uVar7 = CTable[(ulong)*(byte *)((long)src + (uVar8 - 0xc)) + 1];
        if (0xc < (uVar7 & 0xff)) goto LAB_001a8822;
        local_58.bitPos[1] = lVar14 + uVar7;
        local_58.bitContainer[1] = uVar7 & 0xffffffffffffff00 | uVar10 >> ((byte)uVar7 & 0x3f);
        if (0x40 < (local_58.bitPos[1] & 0xff)) goto LAB_001a8803;
        if ((int)(local_58.bitPos[1] & 0xff) == 0x40) goto LAB_001a88bd;
        local_58.bitContainer[0] =
             local_58.bitContainer[0] >> ((byte)local_58.bitPos[1] & 0x3f) |
             local_58.bitContainer[1];
        uVar10 = local_58.bitPos[1] + local_58.bitPos[0];
        uVar7 = uVar10 & 0xff;
        if (0x40 < uVar7) goto LAB_001a889e;
        local_58.bitPos[0] = (size_t)((uint)uVar10 & 7);
        if (uVar7 == 0) goto LAB_001a8841;
        *puVar12 = local_58.bitContainer[0] >> (-(char)uVar10 & 0x3fU);
        local_58.ptr = (BYTE *)((uVar7 >> 3) + (long)puVar12);
        if (local_58.endPtr < local_58.ptr) goto LAB_001a887f;
        srcSize = uVar8 - 0xc;
        lVar2 = lVar2 + -0xc;
        lVar6 = lVar6 + -0xc;
        bVar1 = 0xc < (long)uVar8;
        uVar8 = srcSize;
      } while (bVar1);
    }
    break;
  case 10:
    if (0 < (int)uVar4 % 5) {
      pbVar5 = (byte *)((long)(int)uVar4 + (long)src);
      iVar13 = (int)uVar4 % 5 + 1;
      uVar8 = 0;
      do {
        pbVar5 = pbVar5 + -1;
        uVar10 = CTable[(ulong)*pbVar5 + 1];
        if (0xc < (uVar10 & 0xff)) goto LAB_001a8822;
        uVar8 = uVar8 + uVar10;
        local_58.bitContainer[0] =
             uVar10 & 0xffffffffffffff00 | local_58.bitContainer[0] >> ((byte)uVar10 & 0x3f);
        uVar10 = uVar8 & 0xff;
        if (0x40 < uVar10) goto LAB_001a8803;
        srcSize = (size_t)((int)srcSize - 1);
        iVar13 = iVar13 + -1;
      } while (1 < iVar13);
      local_58.bitPos[0] = (size_t)((uint)uVar8 & 7);
      if (uVar10 == 0) goto LAB_001a8841;
      if (local_58.endPtr < dst) goto LAB_001a8860;
      *(size_t *)dst = local_58.bitContainer[0] >> (-(char)uVar8 & 0x3fU);
      local_58.ptr = (BYTE *)((long)dst + (uVar10 >> 3));
      if (local_58.endPtr < local_58.ptr) goto LAB_001a887f;
    }
    iVar13 = (int)srcSize * -0x33333333;
    if (0x33333332 < iVar13 + 0x19999999U) goto LAB_001a88dc;
    uVar4 = iVar13 + 0x19999998;
    if (0x19999998 < (uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f)) {
      lVar2 = (long)(int)srcSize;
      lVar6 = 4;
      sVar9 = local_58.bitPos[0];
      sVar11 = local_58.bitContainer[0];
      do {
        uVar8 = CTable[(ulong)*(byte *)((long)src + lVar6 + lVar2 + -5) + 1];
        if (0xc < (uVar8 & 0xff)) goto LAB_001a8822;
        sVar9 = sVar9 + uVar8;
        if (0x40 < ((uint)sVar9 & 0xff)) goto LAB_001a8803;
        sVar11 = sVar11 >> ((byte)uVar8 & 0x3f) | uVar8;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
      uVar8 = CTable[(ulong)*(byte *)((long)src + lVar2 + -5) + 1];
      if (0xc < (uVar8 & 0xff)) goto LAB_001a8822;
      local_58.bitContainer[0] = sVar11 >> ((byte)uVar8 & 0x3f) | uVar8;
      uVar8 = sVar9 + uVar8;
      uVar10 = uVar8 & 0xff;
      if (0x40 < uVar10) goto LAB_001a8803;
      local_58.bitPos[0] = (size_t)((uint)uVar8 & 7);
      if (uVar10 == 0) goto LAB_001a8841;
      if (local_58.endPtr < local_58.ptr) goto LAB_001a8860;
      *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-(char)uVar8 & 0x3fU);
      local_58.ptr = (BYTE *)((uVar10 >> 3) + (long)local_58.ptr);
      if (local_58.endPtr < local_58.ptr) goto LAB_001a887f;
      srcSize = lVar2 - 5;
    }
    uVar4 = (int)srcSize * -0x33333333 + 0x19999998;
    if (0x19999998 < (uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f)) goto LAB_001a88fb;
    if (0 < (int)srcSize) {
      uVar8 = srcSize & 0xffffffff;
      lVar2 = (long)src + (uVar8 - 1);
      lVar6 = (long)src + (uVar8 - 6);
      do {
        lVar14 = 4;
        sVar9 = local_58.bitContainer[0];
        sVar11 = local_58.bitPos[0];
        do {
          uVar10 = CTable[(ulong)*(byte *)(lVar2 + -4 + lVar14) + 1];
          if (0xc < (uVar10 & 0xff)) goto LAB_001a8822;
          sVar11 = sVar11 + uVar10;
          if (0x40 < ((uint)sVar11 & 0xff)) goto LAB_001a8803;
          sVar9 = sVar9 >> ((byte)uVar10 & 0x3f) | uVar10;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
        uVar10 = CTable[(ulong)*(byte *)((uVar8 - 5) + (long)src) + 1];
        if (0xc < (uVar10 & 0xff)) goto LAB_001a8822;
        local_58.bitContainer[0] = sVar9 >> ((byte)uVar10 & 0x3f) | uVar10;
        uVar10 = sVar11 + uVar10;
        uVar7 = uVar10 & 0xff;
        if (0x40 < uVar7) goto LAB_001a8803;
        local_58.bitPos[0] = (size_t)((uint)uVar10 & 7);
        if (uVar7 == 0) goto LAB_001a8841;
        if (local_58.endPtr < local_58.ptr) goto LAB_001a8860;
        *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-(char)uVar10 & 0x3fU);
        puVar12 = (ulong *)((uVar7 >> 3) + (long)local_58.ptr);
        if (local_58.endPtr < puVar12) goto LAB_001a887f;
        lVar15 = 4;
        lVar14 = 0;
        uVar10 = 0;
        do {
          uVar7 = CTable[(ulong)*(byte *)(lVar6 + -4 + lVar15) + 1];
          if (0xc < (uVar7 & 0xff)) goto LAB_001a8822;
          lVar14 = lVar14 + uVar7;
          if (0x40 < ((uint)lVar14 & 0xff)) goto LAB_001a8803;
          uVar10 = uVar10 >> ((byte)uVar7 & 0x3f) | uVar7;
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
        uVar7 = CTable[(ulong)*(byte *)((long)src + (uVar8 - 10)) + 1];
        if (0xc < (uVar7 & 0xff)) goto LAB_001a8822;
        local_58.bitContainer[1] = uVar10 >> ((byte)uVar7 & 0x3f) | uVar7;
        local_58.bitPos[1] = lVar14 + uVar7;
        if (0x40 < (local_58.bitPos[1] & 0xff)) goto LAB_001a8803;
        if ((int)(local_58.bitPos[1] & 0xff) == 0x40) goto LAB_001a88bd;
        local_58.bitContainer[0] =
             local_58.bitContainer[0] >> ((byte)local_58.bitPos[1] & 0x3f) |
             local_58.bitContainer[1];
        uVar10 = local_58.bitPos[1] + local_58.bitPos[0];
        uVar7 = uVar10 & 0xff;
        if (0x40 < uVar7) goto LAB_001a889e;
        local_58.bitPos[0] = (size_t)((uint)uVar10 & 7);
        if (uVar7 == 0) goto LAB_001a8841;
        *puVar12 = local_58.bitContainer[0] >> (-(char)uVar10 & 0x3fU);
        local_58.ptr = (BYTE *)((uVar7 >> 3) + (long)puVar12);
        if (local_58.endPtr < local_58.ptr) goto LAB_001a887f;
        srcSize = uVar8 - 10;
        lVar2 = lVar2 + -10;
        lVar6 = lVar6 + -10;
        bVar1 = 10 < (long)uVar8;
        uVar8 = srcSize;
      } while (bVar1);
    }
    break;
  case 0xb:
    if (0 < (int)uVar4 % 5) {
      pbVar5 = (byte *)((long)(int)uVar4 + (long)src);
      iVar13 = (int)uVar4 % 5 + 1;
      uVar8 = 0;
      do {
        pbVar5 = pbVar5 + -1;
        uVar10 = CTable[(ulong)*pbVar5 + 1];
        if (0xc < (uVar10 & 0xff)) goto LAB_001a8822;
        uVar8 = uVar8 + uVar10;
        local_58.bitContainer[0] =
             uVar10 & 0xffffffffffffff00 | local_58.bitContainer[0] >> ((byte)uVar10 & 0x3f);
        uVar10 = uVar8 & 0xff;
        if (0x40 < uVar10) goto LAB_001a8803;
        srcSize = (size_t)((int)srcSize - 1);
        iVar13 = iVar13 + -1;
      } while (1 < iVar13);
      local_58.bitPos[0] = (size_t)((uint)uVar8 & 7);
      if (uVar10 == 0) goto LAB_001a8841;
      if (local_58.endPtr < dst) goto LAB_001a8860;
      *(size_t *)dst = local_58.bitContainer[0] >> (-(char)uVar8 & 0x3fU);
      local_58.ptr = (BYTE *)((long)dst + (uVar10 >> 3));
      if (local_58.endPtr < local_58.ptr) goto LAB_001a887f;
    }
    iVar13 = (int)srcSize * -0x33333333;
    if (0x33333332 < iVar13 + 0x19999999U) goto LAB_001a88dc;
    uVar4 = iVar13 + 0x19999998;
    if (0x19999998 < (uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f)) {
      lVar2 = (long)(int)srcSize;
      lVar6 = 4;
      sVar9 = local_58.bitPos[0];
      sVar11 = local_58.bitContainer[0];
      do {
        uVar8 = CTable[(ulong)*(byte *)((long)src + lVar6 + lVar2 + -5) + 1];
        if (0xc < (uVar8 & 0xff)) goto LAB_001a8822;
        sVar9 = sVar9 + uVar8;
        if (0x40 < ((uint)sVar9 & 0xff)) goto LAB_001a8803;
        sVar11 = sVar11 >> ((byte)uVar8 & 0x3f) | uVar8;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
      uVar8 = CTable[(ulong)*(byte *)((long)src + lVar2 + -5) + 1];
      if (0xc < (uVar8 & 0xff)) goto LAB_001a8822;
      uVar10 = sVar9 + uVar8;
      local_58.bitContainer[0] = uVar8 & 0xffffffffffffff00 | sVar11 >> ((byte)uVar8 & 0x3f);
      uVar8 = uVar10 & 0xff;
      if (0x40 < uVar8) goto LAB_001a8803;
      local_58.bitPos[0] = (size_t)((uint)uVar10 & 7);
      if (uVar8 == 0) goto LAB_001a8841;
      if (local_58.endPtr < local_58.ptr) goto LAB_001a8860;
      *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-(char)uVar10 & 0x3fU);
      local_58.ptr = (BYTE *)((uVar8 >> 3) + (long)local_58.ptr);
      if (local_58.endPtr < local_58.ptr) goto LAB_001a887f;
      srcSize = lVar2 - 5;
    }
    uVar4 = (int)srcSize * -0x33333333 + 0x19999998;
    if (0x19999998 < (uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f)) goto LAB_001a88fb;
    if (0 < (int)srcSize) {
      uVar8 = srcSize & 0xffffffff;
      lVar2 = (long)src + (uVar8 - 1);
      lVar6 = (long)src + (uVar8 - 6);
      do {
        lVar14 = 4;
        sVar9 = local_58.bitContainer[0];
        sVar11 = local_58.bitPos[0];
        do {
          uVar10 = CTable[(ulong)*(byte *)(lVar2 + -4 + lVar14) + 1];
          if (0xc < (uVar10 & 0xff)) goto LAB_001a8822;
          sVar11 = sVar11 + uVar10;
          if (0x40 < ((uint)sVar11 & 0xff)) goto LAB_001a8803;
          sVar9 = sVar9 >> ((byte)uVar10 & 0x3f) | uVar10;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
        uVar10 = CTable[(ulong)*(byte *)((uVar8 - 5) + (long)src) + 1];
        if (0xc < (uVar10 & 0xff)) goto LAB_001a8822;
        uVar7 = sVar11 + uVar10;
        local_58.bitContainer[0] = uVar10 & 0xffffffffffffff00 | sVar9 >> ((byte)uVar10 & 0x3f);
        uVar10 = uVar7 & 0xff;
        if (0x40 < uVar10) goto LAB_001a8803;
        local_58.bitPos[0] = (size_t)((uint)uVar7 & 7);
        if (uVar10 == 0) goto LAB_001a8841;
        if (local_58.endPtr < local_58.ptr) goto LAB_001a8860;
        *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-(char)uVar7 & 0x3fU);
        puVar12 = (ulong *)((uVar10 >> 3) + (long)local_58.ptr);
        if (local_58.endPtr < puVar12) goto LAB_001a887f;
        lVar15 = 4;
        lVar14 = 0;
        uVar10 = 0;
        do {
          uVar7 = CTable[(ulong)*(byte *)(lVar6 + -4 + lVar15) + 1];
          if (0xc < (uVar7 & 0xff)) goto LAB_001a8822;
          lVar14 = lVar14 + uVar7;
          if (0x40 < ((uint)lVar14 & 0xff)) goto LAB_001a8803;
          uVar10 = uVar10 >> ((byte)uVar7 & 0x3f) | uVar7;
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
        uVar7 = CTable[(ulong)*(byte *)((long)src + (uVar8 - 10)) + 1];
        if (0xc < (uVar7 & 0xff)) goto LAB_001a8822;
        local_58.bitPos[1] = lVar14 + uVar7;
        local_58.bitContainer[1] = uVar7 & 0xffffffffffffff00 | uVar10 >> ((byte)uVar7 & 0x3f);
        if (0x40 < (local_58.bitPos[1] & 0xff)) goto LAB_001a8803;
        if ((int)(local_58.bitPos[1] & 0xff) == 0x40) goto LAB_001a88bd;
        local_58.bitContainer[0] =
             local_58.bitContainer[0] >> ((byte)local_58.bitPos[1] & 0x3f) |
             local_58.bitContainer[1];
        uVar10 = local_58.bitPos[1] + local_58.bitPos[0];
        uVar7 = uVar10 & 0xff;
        if (0x40 < uVar7) goto LAB_001a889e;
        local_58.bitPos[0] = (size_t)((uint)uVar10 & 7);
        if (uVar7 == 0) goto LAB_001a8841;
        *puVar12 = local_58.bitContainer[0] >> (-(char)uVar10 & 0x3fU);
        local_58.ptr = (BYTE *)((uVar7 >> 3) + (long)puVar12);
        if (local_58.endPtr < local_58.ptr) goto LAB_001a887f;
        srcSize = uVar8 - 10;
        lVar2 = lVar2 + -10;
        lVar6 = lVar6 + -10;
        bVar1 = 10 < (long)uVar8;
        uVar8 = srcSize;
      } while (bVar1);
    }
    break;
  default:
    if (0 < (int)uVar4 % 9) {
      pbVar5 = (byte *)((long)(int)uVar4 + (long)src);
      iVar13 = (int)uVar4 % 9 + 1;
      uVar8 = 0;
      do {
        pbVar5 = pbVar5 + -1;
        uVar10 = CTable[(ulong)*pbVar5 + 1];
        if (0xc < (uVar10 & 0xff)) goto LAB_001a8822;
        uVar8 = uVar8 + uVar10;
        local_58.bitContainer[0] =
             uVar10 & 0xffffffffffffff00 | local_58.bitContainer[0] >> ((byte)uVar10 & 0x3f);
        uVar10 = uVar8 & 0xff;
        if (0x40 < uVar10) goto LAB_001a8803;
        srcSize = (size_t)((int)srcSize - 1);
        iVar13 = iVar13 + -1;
      } while (1 < iVar13);
      local_58.bitPos[0] = (size_t)((uint)uVar8 & 7);
      if (uVar10 == 0) goto LAB_001a8841;
      if (local_58.endPtr < dst) goto LAB_001a8860;
      *(size_t *)dst = local_58.bitContainer[0] >> (-(char)uVar8 & 0x3fU);
      local_58.ptr = (BYTE *)((long)dst + (uVar10 >> 3));
      if (local_58.endPtr < local_58.ptr) goto LAB_001a887f;
    }
    uVar4 = (int)srcSize * 0x38e38e39 + 0xe38e38e;
    if (0x1c71c71c < uVar4) goto LAB_001a88dc;
    if (0xe38e38e < (uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f)) {
      lVar2 = (long)(int)srcSize;
      lVar6 = 8;
      sVar9 = local_58.bitPos[0];
      sVar11 = local_58.bitContainer[0];
      do {
        uVar8 = CTable[(ulong)*(byte *)((long)src + lVar6 + lVar2 + -9) + 1];
        if (0xc < (uVar8 & 0xff)) goto LAB_001a8822;
        sVar9 = sVar9 + uVar8;
        if (0x40 < ((uint)sVar9 & 0xff)) goto LAB_001a8803;
        sVar11 = sVar11 >> ((byte)uVar8 & 0x3f) | uVar8;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
      uVar8 = CTable[(ulong)*(byte *)((long)src + lVar2 + -9) + 1];
      if (0xc < (uVar8 & 0xff)) goto LAB_001a8822;
      local_58.bitContainer[0] = sVar11 >> ((byte)uVar8 & 0x3f) | uVar8;
      uVar8 = sVar9 + uVar8;
      uVar10 = uVar8 & 0xff;
      if (0x40 < uVar10) goto LAB_001a8803;
      local_58.bitPos[0] = (size_t)((uint)uVar8 & 7);
      if (uVar10 == 0) goto LAB_001a8841;
      if (local_58.endPtr < local_58.ptr) goto LAB_001a8860;
      *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-(char)uVar8 & 0x3fU);
      local_58.ptr = (BYTE *)((uVar10 >> 3) + (long)local_58.ptr);
      if (local_58.endPtr < local_58.ptr) goto LAB_001a887f;
      srcSize = lVar2 - 9;
    }
    uVar4 = (int)srcSize * 0x38e38e39 + 0xe38e38e;
    if (0xe38e38e < (uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f)) goto LAB_001a88fb;
    if (0 < (int)srcSize) {
      uVar8 = srcSize & 0xffffffff;
      lVar2 = (long)src + (uVar8 - 1);
      lVar6 = (long)src + (uVar8 - 10);
      do {
        lVar14 = 8;
        sVar9 = local_58.bitContainer[0];
        sVar11 = local_58.bitPos[0];
        do {
          uVar10 = CTable[(ulong)*(byte *)(lVar2 + -8 + lVar14) + 1];
          if (0xc < (uVar10 & 0xff)) goto LAB_001a8822;
          sVar11 = sVar11 + uVar10;
          if (0x40 < ((uint)sVar11 & 0xff)) goto LAB_001a8803;
          sVar9 = sVar9 >> ((byte)uVar10 & 0x3f) | uVar10;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
        uVar10 = CTable[(ulong)*(byte *)((uVar8 - 9) + (long)src) + 1];
        if (0xc < (uVar10 & 0xff)) goto LAB_001a8822;
        local_58.bitContainer[0] = sVar9 >> ((byte)uVar10 & 0x3f) | uVar10;
        uVar10 = sVar11 + uVar10;
        uVar7 = uVar10 & 0xff;
        if (0x40 < uVar7) goto LAB_001a8803;
        local_58.bitPos[0] = (size_t)((uint)uVar10 & 7);
        if (uVar7 == 0) goto LAB_001a8841;
        if (local_58.endPtr < local_58.ptr) goto LAB_001a8860;
        *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-(char)uVar10 & 0x3fU);
        puVar12 = (ulong *)((uVar7 >> 3) + (long)local_58.ptr);
        if (local_58.endPtr < puVar12) goto LAB_001a887f;
        lVar15 = 8;
        lVar14 = 0;
        uVar10 = 0;
        do {
          uVar7 = CTable[(ulong)*(byte *)(lVar6 + -8 + lVar15) + 1];
          if (0xc < (uVar7 & 0xff)) goto LAB_001a8822;
          lVar14 = lVar14 + uVar7;
          if (0x40 < ((uint)lVar14 & 0xff)) goto LAB_001a8803;
          uVar10 = uVar10 >> ((byte)uVar7 & 0x3f) | uVar7;
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
        uVar7 = CTable[(ulong)*(byte *)((long)src + (uVar8 - 0x12)) + 1];
        if (0xc < (uVar7 & 0xff)) goto LAB_001a8822;
        local_58.bitContainer[1] = uVar10 >> ((byte)uVar7 & 0x3f) | uVar7;
        local_58.bitPos[1] = lVar14 + uVar7;
        if (0x40 < (local_58.bitPos[1] & 0xff)) goto LAB_001a8803;
        if ((int)(local_58.bitPos[1] & 0xff) == 0x40) goto LAB_001a88bd;
        local_58.bitContainer[0] =
             local_58.bitContainer[0] >> ((byte)local_58.bitPos[1] & 0x3f) |
             local_58.bitContainer[1];
        uVar10 = local_58.bitPos[1] + local_58.bitPos[0];
        uVar7 = uVar10 & 0xff;
        if (0x40 < uVar7) goto LAB_001a889e;
        local_58.bitPos[0] = (size_t)((uint)uVar10 & 7);
        if (uVar7 == 0) goto LAB_001a8841;
        *puVar12 = local_58.bitContainer[0] >> (-(char)uVar10 & 0x3fU);
        local_58.ptr = (BYTE *)((uVar7 >> 3) + (long)puVar12);
        if (local_58.endPtr < local_58.ptr) goto LAB_001a887f;
        srcSize = uVar8 - 0x12;
        lVar2 = lVar2 + -0x12;
        lVar6 = lVar6 + -0x12;
        bVar1 = 0x12 < (long)uVar8;
        uVar8 = srcSize;
      } while (bVar1);
    }
  }
LAB_001a87dd:
  if ((int)srcSize != 0) {
    __assert_fail("n == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3ecb,
                  "void HUF_compress1X_usingCTable_internal_body_loop(HUF_CStream_t *, const BYTE *, size_t, const HUF_CElt *, int, int, int)"
                 );
  }
  if (local_58.endPtr < local_58.ptr) {
    __assert_fail("bitC.ptr <= bitC.endPtr",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3f16,
                  "size_t HUF_compress1X_usingCTable_internal_body(void *, size_t, const void *, size_t, const HUF_CElt *)"
                 );
  }
  sVar9 = HUF_closeCStream(&local_58);
  return sVar9;
}

Assistant:

FORCE_INLINE_TEMPLATE size_t
HUF_compress1X_usingCTable_internal_body(void* dst, size_t dstSize,
                                   const void* src, size_t srcSize,
                                   const HUF_CElt* CTable)
{
    U32 const tableLog = (U32)CTable[0];
    HUF_CElt const* ct = CTable + 1;
    const BYTE* ip = (const BYTE*) src;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;
    HUF_CStream_t bitC;

    /* init */
    if (dstSize < 8) return 0;   /* not enough space to compress */
    { size_t const initErr = HUF_initCStream(&bitC, op, (size_t)(oend-op));
      if (HUF_isError(initErr)) return 0; }

    if (dstSize < HUF_tightCompressBound(srcSize, (size_t)tableLog) || tableLog > 11)
        HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ MEM_32bits() ? 2 : 4, /* kFast */ 0, /* kLastFast */ 0);
    else {
        if (MEM_32bits()) {
            switch (tableLog) {
            case 11:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 2, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 10: ZSTD_FALLTHROUGH;
            case 9: ZSTD_FALLTHROUGH;
            case 8:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 2, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            case 7: ZSTD_FALLTHROUGH;
            default:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 3, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            }
        } else {
            switch (tableLog) {
            case 11:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 5, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 10:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 5, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            case 9:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 6, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 8:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 7, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 7:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 8, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 6: ZSTD_FALLTHROUGH;
            default:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 9, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            }
        }
    }
    assert(bitC.ptr <= bitC.endPtr);

    return HUF_closeCStream(&bitC);
}